

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::addOutput
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr spec)

{
  StringPtr pathText;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  __ino_t _Var4;
  StringPtr local_178;
  StringPtr spec_local;
  Array<kj::String> local_158;
  NullableValue<kj::Path> local_138;
  NullableValue<kj::Path> local_118;
  stat stats;
  PathPtr local_68;
  OutputDirective local_58;
  
  spec_local.content.size_ = spec.content.size_;
  spec_local.content.ptr = spec.content.ptr;
  kj::StringPtr::findFirst((StringPtr *)&stats,(char)&spec_local);
  pcVar3 = spec_local.content.ptr;
  if ((char)stats.st_dev != '\x01') {
    stats.st_ino = spec_local.content.size_ - 1;
    local_138.isSet = false;
    stats.st_dev = (__dev_t)spec_local.content.ptr;
    kj::Maybe<kj::Path>::Maybe((Maybe<kj::Path> *)&stats.st_nlink,(Maybe<kj::Path> *)&local_138);
    kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::
    add<capnp::compiler::CompilerMain::OutputDirective>(&this->outputs,(OutputDirective *)&stats);
    kj::_::NullableValue<kj::Path>::~NullableValue((NullableValue<kj::Path> *)&stats.st_nlink);
    kj::_::NullableValue<kj::Path>::~NullableValue(&local_138);
    goto LAB_00119092;
  }
  local_178.content.size_ = spec_local.content.size_ - (stats.st_ino + 1);
  local_178.content.ptr = spec_local.content.ptr + stats.st_ino + 1;
  _Var4 = stats.st_ino;
  if (stats.st_ino == 1) {
    stats.st_dev = (long)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" + 0x3f;
    stats.st_ino = 2;
    bVar1 = kj::StringPtr::startsWith(&local_178,(StringPtr *)&stats);
    _Var4 = 1;
    if (!bVar1) {
      local_58.name.ptr = "\\";
      local_58.name.size_ = 2;
      bVar1 = kj::StringPtr::startsWith(&local_178,(StringPtr *)&local_58);
      if (!bVar1) goto LAB_00118f71;
    }
    kj::StringPtr::findFirst((StringPtr *)&stats,(char)&local_178);
    if ((char)stats.st_dev == '\x01') {
      local_178.content.ptr = local_178.content.ptr + stats.st_ino + 1;
      local_178.content.size_ = local_178.content.size_ - (stats.st_ino + 1);
      _Var4 = stats.st_ino + 2;
      pcVar3 = spec_local.content.ptr;
    }
  }
LAB_00118f71:
  iVar2 = stat64(local_178.content.ptr,(stat64 *)&stats);
  if ((iVar2 < 0) || ((stats.st_mode & 0xf000) != 0x4000)) {
    kj::MainBuilder::Validity::Validity
              (__return_storage_ptr__,"output location is inaccessible or is not a directory");
    return __return_storage_ptr__;
  }
  iVar2 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_68.parts.ptr = (String *)CONCAT44(extraout_var,iVar2);
  pathText.content.size_ = local_178.content.size_;
  pathText.content.ptr = local_178.content.ptr;
  kj::PathPtr::eval((Path *)&local_158,&local_68,pathText);
  local_118.isSet = true;
  local_118.field_1.value.parts.ptr = local_158.ptr;
  local_118.field_1.value.parts.size_ = local_158.size_;
  local_118.field_1.value.parts.disposer = local_158.disposer;
  local_158.ptr = (String *)0x0;
  local_158.size_ = 0;
  local_58.name.ptr = pcVar3;
  local_58.name.size_ = _Var4;
  kj::Maybe<kj::Path>::Maybe(&local_58.dir,(Maybe<kj::Path> *)&local_118);
  kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::
  add<capnp::compiler::CompilerMain::OutputDirective>(&this->outputs,&local_58);
  kj::_::NullableValue<kj::Path>::~NullableValue(&local_58.dir.ptr);
  kj::_::NullableValue<kj::Path>::~NullableValue(&local_118);
  kj::Array<kj::String>::~Array(&local_158);
LAB_00119092:
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addOutput(kj::StringPtr spec) {
    KJ_IF_SOME(split, spec.findFirst(':')) {
      kj::StringPtr dir = spec.slice(split + 1);
      auto plugin = spec.first(split);

      if (split == 1 && (dir.startsWith("/") || dir.startsWith("\\"))) {
        // The colon is the second character and is immediately followed by a slash or backslash.
        // So, the user passed something like `-o c:/foo`. Is this a request to run the C plugin
        // and output to `/foo`? Or are we on Windows, and is this a request to run the plugin
        // `c:/foo`?
        KJ_IF_SOME(split2, dir.findFirst(':')) {
          // There are two colons. The first ':' was the second char, and was followed by '/' or
          // '\', e.g.:
          //     capnp compile -o c:/foo.exe:bar
          //
          // In this case we can conclude that the second colon is actually meant to be the
          // plugin/location separator, and the first colon was simply signifying a drive letter.
          //
          // Proof by contradiction:
          // - Say that none of the colons were meant to be plugin/location separators; i.e. the
          //   whole argument is meant to be a plugin indicator and the location defaults to ".".
          //   -> In this case, the plugin path has two colons, which is not valid.
          //   -> CONTRADICTION
          // - Say that the first colon was meant to be the plugin/location separator.
          //   -> In this case, the second colon must be the drive letter separator for the
          //      output location.
          //   -> However, the output location begins with '/' or '\', which is not a drive letter.
          //   -> CONTRADICTION
          // - Say that there are more colons beyond the first two, and one of these is meant to
          //   be the plugin/location separator.
          //   -> In this case, the plugin path has two or more colons, which is not valid.
          //   -> CONTRADICTION
          //
          // We therefore conclude that the *second* colon is in fact the plugin/location separator.

          dir = dir.slice(split2 + 1);
          plugin = spec.first(split2 + 2);
#if _WIN32
        } else {
          // The user wrote something like:
          //
          //     capnp compile -o c:/foo/bar
          //
          // What does this mean? It depends on what system we're on. On a Unix system, the above
          // clearly is a request to run the `capnpc-c` plugin (perhaps to output C code) and write
          // to the directory /foo/bar. But on Windows, absolute paths do not start with '/', and
          // the above is actually a request to run the plugin `c:/foo/bar`, outputting to the
          // current directory.

          outputs.add(OutputDirective { spec.asArray(), kj::none });
          return true;
#endif
        }
      }

      struct stat stats;
      if (stat(dir.cStr(), &stats) < 0 || !S_ISDIR(stats.st_mode)) {
        return "output location is inaccessible or is not a directory";
      }
      outputs.add(OutputDirective { plugin, disk->getCurrentPath().evalNative(dir) });
    }